

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

void diy::decompose<diy::Bounds<int>>
               (int dim,int rank,Bounds<int> *domain,StaticAssigner *assigner,Master *master,
               BoolVector *share_face,BoolVector *wrap,CoordinateVector *ghosts,
               DivisionsVector *divs)

{
  Assigner *in_RCX;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  RegularDecomposer<diy::Bounds<int>_> *this;
  Master *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe5c;
  Bounds *in_stack_fffffffffffffe60;
  type in_stack_fffffffffffffe6c;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_fffffffffffffe70;
  CoordinateVector *in_stack_fffffffffffffe80;
  DivisionsVector *in_stack_fffffffffffffe88;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  
  Assigner::nblocks(in_RCX);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
  this = (RegularDecomposer<diy::Bounds<int>_> *)&stack0xfffffffffffffe38;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (in_stack_fffffffffffffe70,(int)in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe5c,(BoolVector *)in_stack_fffffffffffffe50,
             (BoolVector *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  RegularDecomposer<diy::Bounds<int>_>::decompose
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             (StaticAssigner *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(this);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_00000018);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_00000018);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10f3c6)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10f3d3)
  ;
  return;
}

Assistant:

void decompose(int                    dim,
                 int                    rank,
                 const Bounds&          domain,
                 const StaticAssigner&  assigner,
                 Master&                master,
                 typename RegularDecomposer<Bounds>::BoolVector       share_face = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::BoolVector       wrap       = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::CoordinateVector ghosts     = typename RegularDecomposer<Bounds>::CoordinateVector(),
                 typename RegularDecomposer<Bounds>::DivisionsVector  divs       = typename RegularDecomposer<Bounds>::DivisionsVector())
  {
    RegularDecomposer<Bounds>(dim, domain, assigner.nblocks(), share_face, wrap, ghosts, divs).decompose(rank, assigner, master);
  }